

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cc
# Opt level: O1

bool __thiscall ToOpEdge::operator<(ToOpEdge *this,ToOpEdge *op2)

{
  uint uVar1;
  uint uVar2;
  PcodeOp *pPVar3;
  PcodeOp *pPVar4;
  AddrSpace *pAVar5;
  ulong uVar6;
  AddrSpace *pAVar7;
  ulong uVar8;
  bool bVar9;
  
  pPVar3 = this->op;
  pPVar4 = op2->op;
  pAVar5 = (pPVar3->start).pc.base;
  uVar6 = (pPVar3->start).pc.offset;
  pAVar7 = (pPVar4->start).pc.base;
  uVar8 = (pPVar4->start).pc.offset;
  if (uVar6 == uVar8 && pAVar5 == pAVar7) {
    uVar2 = (pPVar3->start).order;
    uVar1 = (pPVar4->start).order;
    bVar9 = uVar2 < uVar1;
    if (uVar2 == uVar1) {
      bVar9 = this->slot < op2->slot;
    }
  }
  else if (pAVar5 == pAVar7) {
    bVar9 = uVar6 < uVar8;
  }
  else {
    bVar9 = true;
    if (pAVar5 != (AddrSpace *)0x0) {
      if ((pAVar5 == (AddrSpace *)0xffffffffffffffff) || (pAVar7 == (AddrSpace *)0x0)) {
        bVar9 = false;
      }
      else if (pAVar7 != (AddrSpace *)0xffffffffffffffff) {
        bVar9 = pAVar5->index < pAVar7->index;
      }
    }
  }
  return bVar9;
}

Assistant:

bool ToOpEdge::operator<(const ToOpEdge &op2) const

{
  const Address &addr1( op->getSeqNum().getAddr() );
  const Address &addr2( op2.op->getSeqNum().getAddr() );
  if (addr1 != addr2)
    return (addr1 < addr2);
  uintm ord1 = op->getSeqNum().getOrder();
  uintm ord2 = op2.op->getSeqNum().getOrder();
  if (ord1 != ord2)
    return (ord1 < ord2);
  return (slot < op2.slot);
}